

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint __thiscall kj::_::HashCoder::operator*(HashCoder *this,ArrayPtr<capnp::PipelineOp> arr)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  PipelineOp *pPVar4;
  uint k;
  PipelineOp *e;
  PipelineOp *__end0;
  PipelineOp *__begin0;
  ArrayPtr<capnp::PipelineOp> *__range2;
  uint h;
  uint r;
  uint m;
  HashCoder *this_local;
  ArrayPtr<capnp::PipelineOp> arr_local;
  
  arr_local.ptr = (PipelineOp *)arr.size_;
  this_local = (HashCoder *)arr.ptr;
  sVar3 = ArrayPtr<capnp::PipelineOp>::size((ArrayPtr<capnp::PipelineOp> *)&this_local);
  __range2._4_4_ = (uint)(sVar3 << 2);
  __end0 = ArrayPtr<capnp::PipelineOp>::begin((ArrayPtr<capnp::PipelineOp> *)&this_local);
  pPVar4 = ArrayPtr<capnp::PipelineOp>::end((ArrayPtr<capnp::PipelineOp> *)&this_local);
  for (; __end0 != pPVar4; __end0 = __end0 + 1) {
    uVar1 = hashCode<capnp::PipelineOp&>(__end0);
    __range2._4_4_ =
         (uVar1 * 0x5bd1e995 >> 0x18 ^ uVar1 * 0x5bd1e995) * 0x5bd1e995 ^
         __range2._4_4_ * 0x5bd1e995;
  }
  uVar2 = (__range2._4_4_ >> 0xd ^ __range2._4_4_) * 0x5bd1e995;
  return uVar2 >> 0xf ^ uVar2;
}

Assistant:

inline uint HashCoder::operator*(ArrayPtr<T> arr) const {
  // Hash each array element to create a string of hashes, then murmur2 over those.
  //
  // TODO(perf): Choose a more-modern hash. (See hash.c++.)

  constexpr uint m = 0x5bd1e995;
  constexpr uint r = 24;
  uint h = arr.size() * sizeof(uint);

  for (auto& e: arr) {
    uint k = kj::hashCode(e);
    k *= m;
    k ^= k >> r;
    k *= m;
    h *= m;
    h ^= k;
  }

  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;
  return h;
}